

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::IOEffect::operator==(IOEffect *this,IOEffect *Value)

{
  KBOOL KVar1;
  IOEffect *Value_local;
  IOEffect *this_local;
  
  KVar1 = StandardVariable::operator!=(&this->super_StandardVariable,&Value->super_StandardVariable)
  ;
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->super_StandardVariable).field_0xe == (Value->super_StandardVariable).field_0xe) {
    if ((this->super_StandardVariable).field_0xf == (Value->super_StandardVariable).field_0xf) {
      if (this->m_ui8Eff == Value->m_ui8Eff) {
        if (this->m_ui8EffDtyCyc == Value->m_ui8EffDtyCyc) {
          if (this->m_ui16EffDur == Value->m_ui16EffDur) {
            if (this->m_ui16Proc == Value->m_ui16Proc) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL IOEffect::operator == ( const IOEffect & Value ) const
{
    if( StandardVariable::operator  !=( Value ) )               return false;
    if( m_ui8Status                 != Value.m_ui8Status )      return false;
    if( m_ui8LnkTyp                 != Value.m_ui8LnkTyp )      return false;
    if( m_ui8Eff                    != Value.m_ui8Eff )         return false;
    if( m_ui8EffDtyCyc              != Value.m_ui8EffDtyCyc )   return false;
    if( m_ui16EffDur                != Value.m_ui16EffDur )     return false;
    if( m_ui16Proc                  != Value.m_ui16Proc )       return false;
    return true;
}